

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QList<QGraphicsItem_*> * __thiscall
QGraphicsView::items(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsView *this,QPoint *pos)

{
  long lVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  QGraphicsScene *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  QTransform xinv;
  QRectF local_f8;
  QTransform local_d8;
  undefined1 local_88 [8];
  Representation RStack_80;
  Representation RStack_7c;
  long local_38;
  
  bVar7 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) ||
     (*(long *)(lVar1 + 0x498) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    if (((*(byte *)(lVar1 + 0x300) & 0x10) == 0) && (iVar2 = QTransform::type(), 2 < iVar2)) {
      if ((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) {
        pQVar6 = (QGraphicsScene *)0x0;
      }
      else {
        pQVar6 = *(QGraphicsScene **)(lVar1 + 0x498);
      }
      local_88._0_4_ = (pos->xp).m_i;
      local_88._4_4_ = (pos->yp).m_i;
      RStack_80.m_i = local_88._0_4_;
      RStack_7c.m_i = local_88._4_4_;
      mapToScene((QPolygonF *)&local_d8,this,(QRect *)local_88);
      viewportTransform((QTransform *)local_88,this);
      QGraphicsScene::items
                (__return_storage_ptr__,pQVar6,(QPolygonF *)&local_d8,IntersectsItemShape,
                 DescendingOrder,(QTransform *)local_88);
      if ((QArrayData *)local_d8.m_matrix[0][0] != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8.m_matrix[0][0])->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8.m_matrix[0][0])->_q_value).super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8.m_matrix[0][0])->_q_value).super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate((QArrayData *)local_d8.m_matrix[0][0],0x10,0x10);
        }
      }
    }
    else {
      puVar4 = &DAT_006f5c10;
      puVar5 = (undefined8 *)local_88;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      viewportTransform(&local_d8,this);
      pQVar6 = (QGraphicsScene *)0x0;
      QTransform::inverted((bool *)local_88);
      if (*(long *)(lVar1 + 0x490) != 0) {
        if (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0) {
          pQVar6 = (QGraphicsScene *)0x0;
        }
        else {
          pQVar6 = *(QGraphicsScene **)(lVar1 + 0x498);
        }
      }
      QTransform::mapRect(&local_f8);
      viewportTransform(&local_d8,this);
      QGraphicsScene::items
                (__return_storage_ptr__,pQVar6,&local_f8,IntersectsItemShape,DescendingOrder,
                 &local_d8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsView::items(const QPoint &pos) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QList<QGraphicsItem *>();
    // ### Unify these two, and use the items(QPointF) version in
    // QGraphicsScene instead. The scene items function could use the viewport
    // transform to map the point to a rect/polygon.
    if ((d->identityMatrix || d->matrix.type() <= QTransform::TxScale)) {
        // Use the rect version
        QTransform xinv = viewportTransform().inverted();
        return d->scene->items(xinv.mapRect(QRectF(pos.x(), pos.y(), 1, 1)),
                               Qt::IntersectsItemShape,
                               Qt::DescendingOrder,
                               viewportTransform());
    }
    // Use the polygon version
    return d->scene->items(mapToScene(pos.x(), pos.y(), 1, 1),
                           Qt::IntersectsItemShape,
                           Qt::DescendingOrder,
                           viewportTransform());
}